

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O2

Box<Imath_2_5::Vec3<float>_> * __thiscall
Imath_2_5::affineTransform<float,float>
          (Box<Imath_2_5::Vec3<float>_> *__return_storage_ptr__,Imath_2_5 *this,
          Box<Imath_2_5::Vec3<float>_> *box,Matrix44<float> *m)

{
  bool bVar1;
  int i;
  long lVar2;
  Box<Imath_2_5::Vec3<float>_> *pBVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  bVar1 = Box<Imath_2_5::Vec3<float>_>::isEmpty((Box<Imath_2_5::Vec3<float>_> *)this);
  if ((!bVar1) &&
     (bVar1 = Box<Imath_2_5::Vec3<float>_>::isInfinite((Box<Imath_2_5::Vec3<float>_> *)this), !bVar1
     )) {
    (__return_storage_ptr__->min).x = 3.4028235e+38;
    (__return_storage_ptr__->min).y = 3.4028235e+38;
    *(undefined8 *)&(__return_storage_ptr__->min).z = 0xff7fffff7f7fffff;
    (__return_storage_ptr__->max).y = -3.4028235e+38;
    (__return_storage_ptr__->max).z = -3.4028235e+38;
    pBVar3 = box;
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      fVar5 = (&box[2].min.x)[lVar2];
      (&(__return_storage_ptr__->min).x)[lVar2] = fVar5;
      fVar6 = fVar5;
      for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
        fVar7 = (&(pBVar3->min).x)[lVar4];
        fVar8 = *(float *)(this + lVar4) * fVar7;
        fVar7 = fVar7 * *(float *)(this + lVar4 + 0xc);
        fVar9 = fVar8;
        if (fVar7 <= fVar8) {
          fVar9 = fVar7;
        }
        fVar5 = fVar5 + fVar9;
        if (fVar7 <= fVar8) {
          fVar7 = fVar8;
        }
        fVar6 = fVar6 + fVar7;
      }
      (&(__return_storage_ptr__->min).x)[lVar2] = fVar5;
      (&(__return_storage_ptr__->max).x)[lVar2] = fVar6;
      pBVar3 = (Box<Imath_2_5::Vec3<float>_> *)&(pBVar3->min).y;
    }
    return __return_storage_ptr__;
  }
  Box<Imath_2_5::Vec3<float>_>::Box(__return_storage_ptr__,(Box<Imath_2_5::Vec3<float>_> *)this);
  return __return_storage_ptr__;
}

Assistant:

Box< Vec3<S> >
affineTransform (const Box< Vec3<S> > &box, const Matrix44<T> &m)
{
    //
    // Transform a 3D box by a matrix whose rightmost column
    // is (0 0 0 1), and compute a new box that tightly encloses
    // the transformed box.
    //
    // As in the transform() function, above, we use James Arvo's
    // fast method.
    //

    if (box.isEmpty() || box.isInfinite())
    {
	//
	// A transformed empty or infinite box is still empty or infinite
	//

	return box;
    }

    Box< Vec3<S> > newBox;

    for (int i = 0; i < 3; i++) 
    {
	newBox.min[i] = newBox.max[i] = (S) m[3][i];

	for (int j = 0; j < 3; j++) 
	{
	    S a, b;

	    a = (S) m[j][i] * box.min[j];
	    b = (S) m[j][i] * box.max[j];

	    if (a < b) 
	    {
		newBox.min[i] += a;
		newBox.max[i] += b;
	    }
	    else 
	    {
		newBox.min[i] += b;
		newBox.max[i] += a;
	    }
	}
    }

    return newBox;
}